

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_manager.c
# Opt level: O2

int plugin_manager_destroy_cb(set s,set_key key,set_value val,set_cb_iterate_args args)

{
  code *pcVar1;
  int iVar2;
  plugin p;
  
  if (val == (set_value)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    if (((args != (set_cb_iterate_args)0x0) &&
        (*(undefined8 **)((long)args + 0x18) != (undefined8 *)0x0)) &&
       (pcVar1 = (code *)**(undefined8 **)((long)args + 0x18), pcVar1 != (code *)0x0)) {
      iVar2 = (*pcVar1)(args,val);
    }
    plugin_destroy((plugin)val);
  }
  return iVar2;
}

Assistant:

int plugin_manager_destroy_cb(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	int result = 0;

	(void)s;
	(void)key;

	if (val != NULL)
	{
		plugin p = (plugin)val;

		if (args != NULL)
		{
			plugin_manager manager = (plugin_manager)args;

			if (manager->iface != NULL && manager->iface->clear != NULL)
			{
				/* Call to the clear method of the manager */
				result = manager->iface->clear(manager, p);
			}
		}

		/* Unload the dynamic link library and destroy the plugin */
		plugin_destroy(p);
	}

	return result;
}